

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O2

int __thiscall Fl_Text_Display::longest_vline(Fl_Text_Display *this)

{
  int iVar1;
  int iVar2;
  int i;
  int visLineNum;
  
  iVar2 = 0;
  for (visLineNum = 0; visLineNum < this->mNVisibleLines; visLineNum = visLineNum + 1) {
    iVar1 = measure_vline(this,visLineNum);
    if (iVar2 <= iVar1) {
      iVar2 = iVar1;
    }
  }
  return iVar2;
}

Assistant:

int Fl_Text_Display::longest_vline() const {
  int longest = 0;
  for (int i = 0; i < mNVisibleLines; i++)
    longest = max(longest, measure_vline(i));
  return longest;
}